

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.2.13.10.hpp
# Opt level: O0

bool Catch::startsWith(string *s,string *prefix)

{
  ulong uVar1;
  ulong uVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_RSI;
  undefined1 local_29;
  
  uVar1 = std::__cxx11::string::size();
  uVar2 = std::__cxx11::string::size();
  local_29 = false;
  if (uVar2 <= uVar1) {
    __last1._M_current = (char *)std::__cxx11::string::begin();
    __first2._M_current = (char *)std::__cxx11::string::end();
    std::__cxx11::string::begin();
    local_29 = std::
               equal<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         (in_RSI,__last1,__first2);
  }
  return local_29;
}

Assistant:

bool startsWith( std::string const& s, std::string const& prefix ) {
        return s.size() >= prefix.size() && std::equal(prefix.begin(), prefix.end(), s.begin());
    }